

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sentence.h
# Opt level: O2

array<std::basic_string_view<char,_std::char_traits<char>_>,_3UL> * __thiscall
jhu::thrax::fields(array<std::basic_string_view<char,_std::char_traits<char>_>,_3UL>
                   *__return_storage_ptr__,thrax *this,string_view line)

{
  size_type sVar1;
  invalid_argument *this_00;
  size_type __pos;
  basic_string_view<char,_std::char_traits<char>_> bVar2;
  string_view line_local;
  
  line_local._M_str = (char *)line._M_len;
  __return_storage_ptr__->_M_elems[2]._M_len = 0;
  __return_storage_ptr__->_M_elems[2]._M_str = (char *)0x0;
  __return_storage_ptr__->_M_elems[1]._M_len = 0;
  __return_storage_ptr__->_M_elems[1]._M_str = (char *)0x0;
  __return_storage_ptr__->_M_elems[0]._M_len = 0;
  __return_storage_ptr__->_M_elems[0]._M_str = (char *)0x0;
  line_local._M_len = (size_t)this;
  sVar1 = std::basic_string_view<char,_std::char_traits<char>_>::find(&line_local,'\t',0);
  if (sVar1 == 0xffffffffffffffff) {
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(this_00,"not enough fields");
  }
  else {
    bVar2 = std::basic_string_view<char,_std::char_traits<char>_>::substr(&line_local,0,sVar1);
    __return_storage_ptr__->_M_elems[0] = bVar2;
    __pos = sVar1 + 1;
    sVar1 = std::basic_string_view<char,_std::char_traits<char>_>::find(&line_local,'\t',__pos);
    if (sVar1 != 0xffffffffffffffff) {
      bVar2 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                        (&line_local,__pos,sVar1 - __pos);
      __return_storage_ptr__->_M_elems[1] = bVar2;
      bVar2 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                        (&line_local,sVar1 + 1,0xffffffffffffffff);
      __return_storage_ptr__->_M_elems[2] = bVar2;
      return __return_storage_ptr__;
    }
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(this_00,"not enough fields");
  }
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

inline auto fields(std::string_view line) {
  std::array<std::string_view, 3> result;
  auto tabPos = line.find('\t');
  if (tabPos == std::string_view::npos) {
    throw std::invalid_argument("not enough fields");
  }
  result[0] = line.substr(0, tabPos);
  auto start = tabPos + 1;
  tabPos = line.find('\t', start);
  if (tabPos == std::string_view::npos) {
    throw std::invalid_argument("not enough fields");
  }
  result[1] = line.substr(start, tabPos - start);
  result[2] = line.substr(tabPos + 1);
  return result;
}